

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O2

string * __thiscall
spvtools::val::ValidationState_t::SpvDecorationString_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,uint32_t decoration)

{
  spv_result_t sVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_12;
  allocator<char> local_11;
  spv_operand_desc desc;
  
  desc = (spv_operand_desc)0x0;
  sVar1 = AssemblyGrammar::lookupOperand
                    (&this->grammar_,SPV_OPERAND_TYPE_DECORATION,decoration,&desc);
  if (sVar1 == SPV_SUCCESS) {
    __s = desc->name;
    __a = &local_12;
  }
  else {
    __s = "Unknown";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string SpvDecorationString(uint32_t decoration) {
    spv_operand_desc desc = nullptr;
    if (grammar_.lookupOperand(SPV_OPERAND_TYPE_DECORATION, decoration,
                               &desc) != SPV_SUCCESS) {
      return std::string("Unknown");
    }
    return std::string(desc->name);
  }